

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  bool bVar7;
  
  bVar7 = nidx < (long)(this->_values)._size;
  if (bVar7 && -1 < nidx) {
    pSVar4 = (this->_values)._vals;
    SVar2 = pSVar4[nidx].super_SQObject._type;
    pSVar5 = pSVar4[nidx].super_SQObject._unVal.pTable;
    pSVar6 = (val->super_SQObject)._unVal.pTable;
    pSVar4[nidx].super_SQObject._unVal.pTable = pSVar6;
    SVar3 = (val->super_SQObject)._type;
    pSVar4[nidx].super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar7 && -1 < nidx;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            _values[nidx]=val;
            return true;
        }
        else return false;
    }